

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

pair<int,_int> embree::quad_index2(int p,int a0,int a1,int b0,int b1)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_8;
  
  if (in_ECX == in_ESI) {
    local_8 = std::make_pair<int,int&>
                        ((int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int *)0x1e6abd);
  }
  else if (in_ECX == in_EDX) {
    local_8 = std::make_pair<int,int&>
                        ((int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int *)0x1e6aeb);
  }
  else if (in_R8D == in_ESI) {
    local_8 = std::make_pair<int,int&>
                        ((int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int *)0x1e6b16);
  }
  else if (in_R8D == in_EDX) {
    local_8 = std::make_pair<int,int&>
                        ((int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int *)0x1e6b41);
  }
  else {
    local_8 = std::make_pair<int,int>
                        ((int *)CONCAT44(0xffffffff,in_stack_ffffffffffffffc8),(int *)0x1e6b67);
  }
  return local_8;
}

Assistant:

std::pair<int,int> quad_index2(int p, int a0, int a1, int b0, int b1)
  {
    if      (b0 == a0) return std::make_pair(p-1,b1);
    else if (b0 == a1) return std::make_pair(p+0,b1);
    else if (b1 == a0) return std::make_pair(p-1,b0);
    else if (b1 == a1) return std::make_pair(p+0,b0);
    else return std::make_pair(0,-1);
  }